

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

int4 __thiscall DecisionNode::getNumFixed(DecisionNode *this,int4 low,int4 size,bool context)

{
  uintm uVar1;
  size_type sVar2;
  reference pvVar3;
  int local_3c;
  int local_2c;
  int4 i;
  uintm m;
  uintm mask;
  int4 count;
  bool context_local;
  int4 size_local;
  int4 low_local;
  DecisionNode *this_local;
  
  m = 0;
  if (size == 0x20) {
    local_3c = 0;
  }
  else {
    local_3c = 1 << ((byte)size & 0x1f);
  }
  local_2c = 0;
  while( true ) {
    sVar2 = std::
            vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
            ::size(&this->list);
    if (sVar2 <= (ulong)(long)local_2c) break;
    pvVar3 = std::
             vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
             ::operator[](&this->list,(long)local_2c);
    uVar1 = DisjointPattern::getMask(pvVar3->first,low,size,context);
    if ((uVar1 & local_3c - 1U) == local_3c - 1U) {
      m = m + 1;
    }
    local_2c = local_2c + 1;
  }
  return m;
}

Assistant:

int4 DecisionNode::getNumFixed(int4 low,int4 size,bool context)

{				// Get number of patterns that specify this field
  int4 count = 0;
  uintm mask;
				// Bits which must be specified in the mask
  uintm m = (size==8*sizeof(uintm)) ? 0 : (((uintm)1)<<size);
  m = m-1;

  for(int4 i=0;i<list.size();++i) {
    mask = list[i].first->getMask(low,size,context);
    if ((mask&m)==m)
      count += 1;
  }
  return count;
}